

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O3

optional<const_tinyusdz::Prim_*> *
tinyusdz::anon_unknown_28::GetPrimAtPathRec
          (optional<const_tinyusdz::Prim_*> *__return_storage_ptr__,Prim *parent,string *parent_path
          ,Path *path,uint32_t depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pPVar4;
  _Alloc_hider _Var5;
  int iVar6;
  optional<const_tinyusdz::Prim_*> *in_RAX;
  long *plVar7;
  optional<const_tinyusdz::Prim_*> *extraout_RAX;
  size_type *psVar8;
  pointer parent_00;
  bool bVar9;
  string elementName;
  string abs_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_b0;
  storage_t<const_tinyusdz::Prim_*> local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  if (parent == (Prim *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    __return_storage_ptr__->contained = (storage_t<const_tinyusdz::Prim_*>)0x0;
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_b0 = local_a0;
    pcVar2 = (parent->_elementPath)._prim_part._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,
               pcVar2 + (parent->_elementPath)._prim_part._M_string_length);
    local_50[0] = local_40;
    pcVar3 = (parent_path->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar3,pcVar3 + parent_path->_M_string_length);
    ::std::__cxx11::string::append((char *)local_50);
    plVar7 = (long *)::std::__cxx11::string::_M_append((char *)local_50,(ulong)local_b0);
    paVar1 = &local_70.field_2;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70.field_2._8_8_ = plVar7[3];
      local_70._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_70._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    Path::full_path_name_abi_cxx11_(&local_70,path);
    _Var5._M_p = local_70._M_dataplus._M_p;
    if (local_90._M_string_length == local_70._M_string_length) {
      if (local_90._M_string_length == 0) {
        bVar9 = true;
      }
      else {
        iVar6 = bcmp(local_90._M_dataplus._M_p,local_70._M_dataplus._M_p,local_90._M_string_length);
        bVar9 = iVar6 == 0;
      }
    }
    else {
      bVar9 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar1) {
      operator_delete(_Var5._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar9) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<const_tinyusdz::Prim_*>)parent;
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
    }
    else {
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      parent_00 = (parent->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pPVar4 = (parent->_children).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (parent_00 != pPVar4) {
        do {
          GetPrimAtPathRec((optional<const_tinyusdz::Prim_*> *)&local_b0,parent_00,&local_90,path,
                           depth + 1);
          if (local_b0._0_1_ == (string)0x1) {
            __return_storage_ptr__->has_value_ = true;
            __return_storage_ptr__->contained = local_a8;
            goto LAB_0030efda;
          }
          parent_00 = parent_00 + 1;
        } while (parent_00 != pPVar4);
      }
      __return_storage_ptr__->has_value_ = false;
      __return_storage_ptr__->contained = (storage_t<const_tinyusdz::Prim_*>)0x0;
    }
LAB_0030efda:
    in_RAX = (optional<const_tinyusdz::Prim_*> *)&local_90.field_2;
    if ((optional<const_tinyusdz::Prim_*> *)local_90._M_dataplus._M_p != in_RAX) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
      in_RAX = extraout_RAX;
    }
  }
  return in_RAX;
}

Assistant:

nonstd::optional<const Prim *> GetPrimAtPathRec(const Prim *parent,
                                                const std::string &parent_path,
                                                const Path &path,
                                                const uint32_t depth) {

  if (!parent) {
    return nonstd::nullopt;
  }

  std::string abs_path;
  // if (auto pv = GetPrimElementName(parent->data())) {
  {
    std::string elementName = parent->element_path().prim_part();
    // DCOUT(pprint::Indent(depth) << "Prim elementName = " << elementName);
    // DCOUT(pprint::Indent(depth) << "Given Path = " << path);
    //  fully absolute path
    abs_path = parent_path + "/" + elementName;
    // DCOUT(pprint::Indent(depth) << "abs_path = " << abs_path);
    // DCOUT(pprint::Indent(depth)
    //       << "queriying path = " << path.full_path_name());
    if (abs_path == path.full_path_name()) {
      // DCOUT(pprint::Indent(depth)
      //       << "Got it! Found Prim at Path = " << abs_path);
      return parent;
    }
  }

  // DCOUT(pprint::Indent(depth)
  //       << "# of children : " << parent->children().size());
  for (const auto &child : parent->children()) {
    // const std::string &p = parent->elementPath.full_path_name();
    // DCOUT(pprint::Indent(depth + 1) << "Parent path : " << abs_path);
    if (auto pv = GetPrimAtPathRec(&child, abs_path, path, depth + 1)) {
      return pv.value();
    }
  }

  return nonstd::nullopt;
}